

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O3

bool __thiscall cursespp::NumberValidator<int>::IsValid(NumberValidator<int> *this,string *input)

{
  int iVar1;
  code *__nptr;
  bool bVar2;
  int *piVar3;
  undefined8 uVar4;
  logic_error *plVar5;
  double dVar6;
  undefined1 auVar7 [12];
  invalid_argument anon_var_0;
  code *local_38 [2];
  
  __nptr = (code *)(input->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  dVar6 = strtod((char *)__nptr,(char **)local_38);
  if (local_38[0] == __nptr) {
    auVar7 = std::__throw_invalid_argument("stod");
    uVar4 = auVar7._0_8_;
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    if (auVar7._8_4_ == 1) {
      plVar5 = (logic_error *)__cxa_get_exception_ptr(uVar4);
      std::logic_error::logic_error((logic_error *)local_38,plVar5);
      local_38[0] = __cxa_atexit;
      __cxa_begin_catch(uVar4);
      std::invalid_argument::~invalid_argument((invalid_argument *)local_38);
      __cxa_end_catch();
      return false;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_001788e5;
    dVar6 = (double)std::__throw_out_of_range("stod");
  }
  *piVar3 = iVar1;
LAB_001788e5:
  if ((this->maximum == 0x7fffffff) ||
     ((bVar2 = false, (double)this->minimum <= dVar6 && (dVar6 <= (double)this->maximum)))) {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool IsValid(const std::string& input) const override {
            try {
                double result = std::stod(input);
                if (bounded(minimum, maximum) && (result < minimum || result > maximum)) {
                    return false;
                }
            }
            catch (std::invalid_argument) {
                return false;
            }
            return true;
        }